

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

JitEquivalentTypeGuard * __thiscall
Lowerer::CreateEquivalentTypeGuardAndLinkToGuardedProperties
          (Lowerer *this,PropertySymOpnd *propertySymOpnd)

{
  Func *pFVar1;
  JitArenaAllocator *this_00;
  code *pcVar2;
  anon_class_16_2_f7db5f92 link;
  ushort uVar3;
  EquivalentTypeSet *this_01;
  JitPolyEquivalentTypeGuard *pJVar4;
  bool bVar5;
  uint8 index;
  bool bVar6;
  uint16 uVar7;
  uint uVar8;
  BVIndex capacity;
  TypeId typeId;
  uint functionId;
  undefined4 *puVar9;
  JITTimeWorkItem *this_02;
  FunctionJITTimeInfo *this_03;
  EquivalentTypeCache *pEVar10;
  JITType *pJVar11;
  intptr_t iVar12;
  BVSparse<Memory::JitArenaAllocator> *pBVar13;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_04;
  JITTimeFunctionBody *this_05;
  char16 *pcVar14;
  char16 *pcVar15;
  Allocator *this_06;
  Memory *this_07;
  EquivalentPropertyEntry *pEVar16;
  ulong uVar17;
  TrackAllocData local_1f0;
  wchar local_1c8 [4];
  char16 debugStringBuffer [42];
  EquivalentPropertyEntry *local_168;
  EquivalentPropertyEntry *entry;
  undefined1 local_158;
  undefined1 local_157;
  uint16 local_156;
  uint uStack_154;
  bool propOpUsesAuxSlot;
  bool isLoadedFromProto;
  bool hasFixedValue;
  PropertyIndex propOpIndex;
  PropertyId propertyId;
  ObjTypeSpecFldInfo *propOpInfo;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex propOpId;
  uint propIdCount;
  TrackAllocData local_108;
  EquivalentPropertyEntry *local_e0;
  EquivalentPropertyEntry *properties;
  BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  propIds;
  bool isTypeStatic;
  uint propOpCount;
  BVSparse<Memory::JitArenaAllocator> *propOps;
  uint16 ti_2;
  JITTypeHolder JStack_80;
  bool there_was_a_null_type;
  ushort local_74;
  ushort local_72;
  uint16 ti_1;
  EquivalentTypeSet *pEStack_70;
  uint16 cachedTypeCount;
  EquivalentTypeSet *typeSet;
  EquivalentTypeCache *cache;
  JitPolyEquivalentTypeGuard *local_58;
  JITTypeHolder local_50;
  JITTypeHolderBase<void> local_48;
  intptr_t local_40;
  intptr_t typeToCache;
  EquivalentTypeSet *pEStack_30;
  uint16 ti;
  EquivalentTypeSet *typeSet_1;
  JitPolyEquivalentTypeGuard *polyGuard;
  JitEquivalentTypeGuard *guard;
  PropertySymOpnd *propertySymOpnd_local;
  Lowerer *this_local;
  
  guard = (JitEquivalentTypeGuard *)propertySymOpnd;
  propertySymOpnd_local = (PropertySymOpnd *)this;
  bVar5 = IR::PropertySymOpnd::HasObjTypeSpecFldInfo(propertySymOpnd);
  if (((!bVar5) ||
      (bVar5 = IR::PropertySymOpnd::HasEquivalentTypeSet((PropertySymOpnd *)guard), !bVar5)) ||
     (pBVar13 = IR::PropertySymOpnd::GetGuardedPropOps((PropertySymOpnd *)guard),
     pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1f15,
                       "(propertySymOpnd->HasObjTypeSpecFldInfo() && propertySymOpnd->HasEquivalentTypeSet() && propertySymOpnd->GetGuardedPropOps())"
                       ,
                       "propertySymOpnd->HasObjTypeSpecFldInfo() && propertySymOpnd->HasEquivalentTypeSet() && propertySymOpnd->GetGuardedPropOps()"
                      );
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar5 = IR::PropertySymOpnd::ShouldUsePolyEquivTypeGuard((PropertySymOpnd *)guard,this->m_func);
  if (bVar5) {
    pFVar1 = this->m_func;
    uVar8 = IR::PropertySymOpnd::GetObjTypeSpecFldId((PropertySymOpnd *)guard);
    typeSet_1 = (EquivalentTypeSet *)Func::CreatePolyEquivalentTypeGuard(pFVar1,uVar8);
    pEStack_30 = IR::PropertySymOpnd::GetEquivalentTypeSet((PropertySymOpnd *)guard);
    for (typeToCache._6_2_ = 0; uVar3 = typeToCache._6_2_,
        uVar7 = Js::EquivalentTypeSet::GetCount(pEStack_30), uVar3 < uVar7;
        typeToCache._6_2_ = typeToCache._6_2_ + 1) {
      local_48.t = (Type)Js::EquivalentTypeSet::GetType(pEStack_30,typeToCache._6_2_);
      pJVar11 = JITTypeHolderBase<void>::operator->(&local_48);
      iVar12 = JITType::GetAddr(pJVar11);
      this_01 = typeSet_1;
      local_40 = iVar12;
      index = Js::JitPolyEquivalentTypeGuard::GetIndexForValue
                        ((JitPolyEquivalentTypeGuard *)typeSet_1,iVar12);
      Js::JitPolyEquivalentTypeGuard::SetPolyValue
                ((JitPolyEquivalentTypeGuard *)this_01,iVar12,index);
    }
    polyGuard = (JitPolyEquivalentTypeGuard *)typeSet_1;
  }
  else {
    pFVar1 = this->m_func;
    local_50 = IR::PropertySymOpnd::GetFirstEquivalentType((PropertySymOpnd *)guard);
    uVar8 = IR::PropertySymOpnd::GetObjTypeSpecFldId((PropertySymOpnd *)guard);
    polyGuard = (JitPolyEquivalentTypeGuard *)Func::CreateEquivalentTypeGuard(pFVar1,local_50,uVar8)
    ;
  }
  this_02 = Func::GetWorkItem(this->m_func);
  this_03 = JITTimeWorkItem::GetJITTimeInfo(this_02);
  bVar5 = FunctionJITTimeInfo::HasSharedPropertyGuards(this_03);
  if (bVar5) {
    pBVar13 = IR::PropertySymOpnd::GetGuardedPropOps((PropertySymOpnd *)guard);
    local_58 = polyGuard;
    link.guard = &polyGuard->super_JitEquivalentTypeGuard;
    link.this = this;
    cache = (EquivalentTypeCache *)this;
    LinkGuardToGuardedProperties<Lowerer::CreateEquivalentTypeGuardAndLinkToGuardedProperties(IR::PropertySymOpnd*)::__0>
              (this,pBVar13,link);
  }
  pEVar10 = Js::JitEquivalentTypeGuard::GetCache(&polyGuard->super_JitEquivalentTypeGuard);
  if (pEVar10 == (EquivalentTypeCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1f3d,"(guard->GetCache() != nullptr)","guard->GetCache() != nullptr");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  typeSet = (EquivalentTypeSet *)
            Js::JitEquivalentTypeGuard::GetCache(&polyGuard->super_JitEquivalentTypeGuard);
  pEStack_70 = IR::PropertySymOpnd::GetEquivalentTypeSet((PropertySymOpnd *)guard);
  uVar7 = Js::EquivalentTypeSet::GetCount(pEStack_70);
  if (uVar7 < 8) {
    local_72 = Js::EquivalentTypeSet::GetCount(pEStack_70);
  }
  else {
    local_72 = 8;
  }
  for (local_74 = 0; local_74 < local_72; local_74 = local_74 + 1) {
    JStack_80 = Js::EquivalentTypeSet::GetType(pEStack_70,local_74);
    pJVar11 = JITTypeHolderBase<void>::operator->(&stack0xffffffffffffff80);
    iVar12 = JITType::GetAddr(pJVar11);
    *(intptr_t *)(&typeSet->sortedAndDuplicatesRemoved + (ulong)local_74 * 8) = iVar12;
  }
  bVar5 = false;
  for (propOps._4_2_ = 0; propOps._4_2_ < local_72; propOps._4_2_ = propOps._4_2_ + 1) {
    if (*(long *)(&typeSet->sortedAndDuplicatesRemoved + (ulong)propOps._4_2_ * 8) == 0) {
      bVar5 = true;
    }
    else if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1f57,"(false)","there_was_a_null_type ? something is wrong here.");
      if (!bVar6) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  pBVar13 = IR::PropertySymOpnd::GetGuardedPropOps((PropertySymOpnd *)guard);
  capacity = BVSparse<Memory::JitArenaAllocator>::Count(pBVar13);
  propIds.stats = (Type)IR::PropertySymOpnd::GetFirstEquivalentType((PropertySymOpnd *)guard);
  pJVar11 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&propIds.stats);
  typeId = JITType::GetTypeId(pJVar11);
  bVar5 = Js::StaticType::Is(typeId);
  JsUtil::
  BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&properties,this->m_alloc,capacity);
  this_00 = this->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_108,(type_info *)&Js::EquivalentPropertyEntry::typeinfo,0,(ulong)capacity,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
             ,0x1f66);
  this_04 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           this_00,&local_108);
  local_e0 = Memory::AllocateArray<Memory::ArenaAllocator,Js::EquivalentPropertyEntry,false>
                       ((Memory *)this_04,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)capacity);
  _curNode._4_4_ = 0;
  for (__startIndex = pBVar13->head; __startIndex != (Type_conflict)0x0;
      __startIndex = __startIndex->next) {
    _unit.word._0_4_ = __startIndex->startIndex;
    propOpInfo = (ObjTypeSpecFldInfo *)(__startIndex->data).word;
    _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&propOpInfo);
    while (_unit.word._4_4_ != 0xffffffff) {
      uVar8 = (Type)_unit.word + _unit.word._4_4_;
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&propOpInfo,_unit.word._4_4_);
      _isLoadedFromProto = Func::GetGlobalObjTypeSpecFldInfo(this->m_func,uVar8);
      uStack_154 = ObjTypeSpecFldInfo::GetPropertyId(_isLoadedFromProto);
      local_156 = 0xffff;
      local_157 = ObjTypeSpecFldInfo::HasFixedValue(_isLoadedFromProto);
      if ((bool)local_157) {
        Js::EquivalentTypeCache::SetHasFixedValue((EquivalentTypeCache *)typeSet);
      }
      local_158 = ObjTypeSpecFldInfo::IsLoadedFromProto(_isLoadedFromProto);
      if ((bool)local_158) {
        Js::EquivalentTypeCache::SetIsLoadedFromProto((EquivalentTypeCache *)typeSet);
      }
      else {
        local_156 = ObjTypeSpecFldInfo::GetSlotIndex(_isLoadedFromProto);
      }
      entry._7_1_ = ObjTypeSpecFldInfo::UsesAuxSlot(_isLoadedFromProto);
      if ((bVar5) && (bVar6 = ObjTypeSpecFldInfo::IsBeingStored(_isLoadedFromProto), bVar6)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1f7e,"(!isTypeStatic || !propOpInfo->IsBeingStored())",
                           "Why are we storing a field to an object of static type?");
        if (!bVar6) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      local_168 = (EquivalentPropertyEntry *)0x0;
      bVar6 = JsUtil::
              BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<int>((BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                  *)&properties,(int *)&stack0xfffffffffffffeac,&local_168);
      if (bVar6) {
        if ((local_156 == local_168->slotIndex) &&
           ((entry._7_1_ & 1) == (local_168->isAuxSlot & 1U))) {
          bVar6 = ObjTypeSpecFldInfo::IsBeingStored(_isLoadedFromProto);
          local_168->mustBeWritable = (local_168->mustBeWritable & 1U) != 0 || bVar6;
        }
        else {
          uVar8 = Func::GetSourceContextId(this->m_func);
          functionId = Func::GetLocalFunctionId(this->m_func);
          bVar6 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar8,functionId);
          if (bVar6) {
            this_05 = Func::GetJITFunctionBody(this->m_func);
            pcVar14 = JITTimeFunctionBody::GetDisplayName(this_05);
            pcVar15 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_1c8);
            Output::Print(L"EquivObjTypeSpec: top function %s (%s): duplicate property clash on %d \n"
                          ,pcVar14,pcVar15,(ulong)uStack_154);
            Output::Flush();
          }
          if (capacity <= _curNode._4_4_) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1f94,"(propIdCount < propOpCount)","propIdCount < propOpCount");
            if (!bVar6) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          uVar17 = (ulong)_curNode._4_4_;
          _curNode._4_4_ = _curNode._4_4_ + 1;
          local_168 = local_e0 + uVar17;
          local_168->propertyId = uStack_154;
          local_168->slotIndex = local_156;
          local_168->isAuxSlot = (bool)(entry._7_1_ & 1);
          bVar6 = ObjTypeSpecFldInfo::IsBeingStored(_isLoadedFromProto);
          local_168->mustBeWritable = bVar6;
        }
      }
      else {
        if (capacity <= _curNode._4_4_) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1f9f,"(propIdCount < propOpCount)","propIdCount < propOpCount");
          if (!bVar6) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        uVar17 = (ulong)_curNode._4_4_;
        _curNode._4_4_ = _curNode._4_4_ + 1;
        local_168 = local_e0 + uVar17;
        local_168->propertyId = uStack_154;
        local_168->slotIndex = local_156;
        local_168->isAuxSlot = (bool)(entry._7_1_ & 1);
        bVar6 = ObjTypeSpecFldInfo::IsBeingStored(_isLoadedFromProto);
        local_168->mustBeWritable = bVar6;
        JsUtil::
        BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::AddNew((BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)&properties,(int *)&stack0xfffffffffffffeac,&local_168);
      }
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&propOpInfo);
    }
    if (__startIndex == (Type_conflict)0x0) break;
  }
  *(uint *)&typeSet[4].types.ptr = _curNode._4_4_;
  this_06 = Func::GetNativeCodeDataAllocator(this->m_func);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_1f0,(type_info *)&Js::EquivalentPropertyEntry::typeinfo,0,(ulong)_curNode._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
             ,0x1fad);
  this_07 = (Memory *)NativeCodeData::Allocator::TrackAllocInfo(this_06,&local_1f0);
  pEVar16 = Memory::
            AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<Js::EquivalentPropertyEntry>>,Js::EquivalentPropertyEntry,false>
                      (this_07,(AllocatorNoFixup<NativeCodeData::Array<Js::EquivalentPropertyEntry>_>
                                *)NativeCodeData::
                                  AllocatorNoFixup<NativeCodeData::Array<Js::EquivalentPropertyEntry>_>
                                  ::Alloc,0,(ulong)_curNode._4_4_);
  *(EquivalentPropertyEntry **)(typeSet + 5) = pEVar16;
  memcpy(*(void **)(typeSet + 5),local_e0,(ulong)_curNode._4_4_ << 3);
  pJVar4 = polyGuard;
  JsUtil::
  BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&properties);
  return &pJVar4->super_JitEquivalentTypeGuard;
}

Assistant:

Js::JitEquivalentTypeGuard*
Lowerer::CreateEquivalentTypeGuardAndLinkToGuardedProperties(IR::PropertySymOpnd* propertySymOpnd)
{
    // We should always have a list of guarded properties.
    Assert(propertySymOpnd->HasObjTypeSpecFldInfo() && propertySymOpnd->HasEquivalentTypeSet() && propertySymOpnd->GetGuardedPropOps());

    Js::JitEquivalentTypeGuard* guard;
    if (propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func))
    {
        Js::JitPolyEquivalentTypeGuard *polyGuard = this->m_func->CreatePolyEquivalentTypeGuard(propertySymOpnd->GetObjTypeSpecFldId());

        // Copy types from the type set to the guard's value locations
        Js::EquivalentTypeSet* typeSet = propertySymOpnd->GetEquivalentTypeSet();
        for (uint16 ti = 0; ti < typeSet->GetCount(); ti++)
        {
            intptr_t typeToCache = typeSet->GetType(ti)->GetAddr();
            polyGuard->SetPolyValue(typeToCache, polyGuard->GetIndexForValue(typeToCache));
        }

        guard = polyGuard;
    }
    else
    {
        guard = this->m_func->CreateEquivalentTypeGuard(propertySymOpnd->GetFirstEquivalentType(), propertySymOpnd->GetObjTypeSpecFldId());
    }

    if (m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        LinkGuardToGuardedProperties(propertySymOpnd->GetGuardedPropOps(), [=](Js::PropertyId propertyId)
        {
            if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("ObjTypeSpec: function %s(%s) registered equivalent type spec guard 0x%p with value 0x%p for property ID %u.\n"),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                    guard, guard->GetValue(), propertyId);
                Output::Flush();
            }

            this->m_func->EnsurePropertyGuardsByPropertyId();
            this->m_func->LinkGuardToPropertyId(propertyId, guard);
        });
    }

    Assert(guard->GetCache() != nullptr);
    Js::EquivalentTypeCache* cache = guard->GetCache();

    // TODO (ObjTypeSpec): If we delayed populating the types until encoder, we could bulk allocate all equivalent type caches
    // in one block from the heap. This would allow us to not allocate them from the native code data allocator and free them
    // when no longer needed. However, we would need to store the global property operation ID in the guard, so we can look up
    // the info in the encoder. Perhaps we could overload the cache pointer to be the ID until encoder.

    // Copy types from the type set to the guard's cache
    Js::EquivalentTypeSet* typeSet = propertySymOpnd->GetEquivalentTypeSet();
    uint16 cachedTypeCount = typeSet->GetCount() < EQUIVALENT_TYPE_CACHE_SIZE ? typeSet->GetCount() : EQUIVALENT_TYPE_CACHE_SIZE;
    for (uint16 ti = 0; ti < cachedTypeCount; ti++)
    {
        cache->types[ti] = (Js::Type*)typeSet->GetType(ti)->GetAddr();
    }

#ifdef DEBUG
    bool there_was_a_null_type = false;
    for (uint16 ti = 0; ti < cachedTypeCount; ti++)
    {
        if (cache->types[ti] == nullptr)
        {
            there_was_a_null_type = true;
        }
        else if (there_was_a_null_type)
        {
            AssertMsg(false, "there_was_a_null_type ? something is wrong here.");
        }
    }
#endif

    // Populate property ID and slot index arrays on the guard's cache. We iterate over the
    // bit vector of property operations protected by this guard, but some property operations
    // may be referring to the same property ID (but not share the same cache). We skip
    // redundant entries by maintaining a hash set of property IDs we've already encountered.

    auto propOps = propertySymOpnd->GetGuardedPropOps();
    uint propOpCount = propOps->Count();

    bool isTypeStatic = Js::StaticType::Is(propertySymOpnd->GetFirstEquivalentType()->GetTypeId());
    JsUtil::BaseDictionary<Js::PropertyId, Js::EquivalentPropertyEntry*, JitArenaAllocator> propIds(this->m_alloc, propOpCount);
    Js::EquivalentPropertyEntry* properties = AnewArray(this->m_alloc, Js::EquivalentPropertyEntry, propOpCount);
    uint propIdCount = 0;

    FOREACH_BITSET_IN_SPARSEBV(propOpId, propOps)
    {
        ObjTypeSpecFldInfo* propOpInfo = this->m_func->GetGlobalObjTypeSpecFldInfo(propOpId);
        Js::PropertyId propertyId = propOpInfo->GetPropertyId();
        Js::PropertyIndex propOpIndex = Js::Constants::NoSlot;
        bool hasFixedValue = propOpInfo->HasFixedValue();
        if (hasFixedValue)
        {
            cache->SetHasFixedValue();
        }
        bool isLoadedFromProto = propOpInfo->IsLoadedFromProto();
        if (isLoadedFromProto)
        {
            cache->SetIsLoadedFromProto();
        }
        else
        {
            propOpIndex = propOpInfo->GetSlotIndex();
        }
        bool propOpUsesAuxSlot = propOpInfo->UsesAuxSlot();

        AssertMsg(!isTypeStatic || !propOpInfo->IsBeingStored(), "Why are we storing a field to an object of static type?");

        Js::EquivalentPropertyEntry* entry = nullptr;
        if (propIds.TryGetValue(propertyId, &entry))
        {
            if (propOpIndex == entry->slotIndex && propOpUsesAuxSlot == entry->isAuxSlot)
            {
                entry->mustBeWritable |= propOpInfo->IsBeingStored();
            }
            else
            {
                // Due to inline cache sharing we have the same property accessed using different caches
                // with inconsistent info. This means a guaranteed bailout on the equivalent type check.
                // We'll just let it happen and turn off the optimization for this function. We could avoid
                // this problem by tracking property information on the value type in glob opt.
                if (PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("EquivObjTypeSpec: top function %s (%s): duplicate property clash on %d \n"),
                        m_func->GetJITFunctionBody()->GetDisplayName(), m_func->GetDebugNumberSet(debugStringBuffer), propertyId);
                    Output::Flush();
                }
                Assert(propIdCount < propOpCount);
                __analysis_assume(propIdCount < propOpCount);
                entry = &properties[propIdCount++];
                entry->propertyId = propertyId;
                entry->slotIndex = propOpIndex;
                entry->isAuxSlot = propOpUsesAuxSlot;
                entry->mustBeWritable = propOpInfo->IsBeingStored();
            }
        }
        else
        {
            Assert(propIdCount < propOpCount);
            __analysis_assume(propIdCount < propOpCount);
            entry = &properties[propIdCount++];
            entry->propertyId = propertyId;
            entry->slotIndex = propOpIndex;
            entry->isAuxSlot = propOpUsesAuxSlot;
            entry->mustBeWritable = propOpInfo->IsBeingStored();
            propIds.AddNew(propertyId, entry);
        }
    }
    NEXT_BITSET_IN_SPARSEBV;

    cache->record.propertyCount = propIdCount;
    // Js::EquivalentPropertyEntry does not contain pointer, no need to fixup
    cache->record.properties = NativeCodeDataNewArrayNoFixup(this->m_func->GetNativeCodeDataAllocator(), Js::EquivalentPropertyEntry, propIdCount);

    memcpy(cache->record.properties, properties, propIdCount * sizeof(Js::EquivalentPropertyEntry));

    return guard;
}